

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

_Bool possible_doorway(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict lVar3;
  chunk_conflict *c_local;
  loc grid_local;
  
  _Var1 = square_in_bounds((chunk *)c,(loc_conflict)grid);
  if (!_Var1) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/gen-cave.c"
                  ,0x325,"_Bool possible_doorway(struct chunk *, struct loc)");
  }
  wVar2 = next_to_corr(c,grid);
  if (L'\x01' < wVar2) {
    lVar3 = (loc_conflict)next_grid(grid,L'\b');
    _Var1 = square_isstrongwall((chunk *)c,lVar3);
    if (_Var1) {
      lVar3 = (loc_conflict)next_grid(grid,L'\x02');
      _Var1 = square_isstrongwall((chunk *)c,lVar3);
      if (_Var1) {
        return true;
      }
    }
    lVar3 = (loc_conflict)next_grid(grid,L'\x04');
    _Var1 = square_isstrongwall((chunk *)c,lVar3);
    if (_Var1) {
      lVar3 = (loc_conflict)next_grid(grid,L'\x06');
      _Var1 = square_isstrongwall((chunk *)c,lVar3);
      if (_Var1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool possible_doorway(struct chunk *c, struct loc grid)
{
	assert(square_in_bounds(c, grid));
	if (next_to_corr(c, grid) < 2)
		return false;
	else if (square_isstrongwall(c, next_grid(grid, DIR_N)) &&
			 square_isstrongwall(c, next_grid(grid, DIR_S)))
		return true;
	else if (square_isstrongwall(c, next_grid(grid, DIR_W)) &&
			 square_isstrongwall(c, next_grid(grid, DIR_E)))
		return true;
	else
		return false;
}